

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stack.cpp
# Opt level: O3

int main(void)

{
  int test_case;
  int local_c;
  
  std::istream::operator>>((istream *)&std::cin,&local_c);
  switch(local_c) {
  case 0:
    test0();
    break;
  case 1:
    test1();
    break;
  case 2:
    test2();
    break;
  case 3:
    test3();
    break;
  case 4:
    test4();
    break;
  case 5:
    test5();
    break;
  case 6:
    test6();
    break;
  case 7:
    test7();
    break;
  case 8:
  case 9:
    break;
  default:
    goto switchD_00102792_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
switchD_00102792_default:
  return 0;
}

Assistant:

int main() {
  int test_case;
  std::cin >> test_case;
  switch(test_case) {
    case 0: if (test0()) std::cout << "OK" << std::endl; break;
    case 1: if (test1()) std::cout << "OK" << std::endl; break;
    case 2: if (test2()) std::cout << "OK" << std::endl; break;
    case 3: if (test3()) std::cout << "OK" << std::endl; break;
    case 4: if (test4()) std::cout << "OK" << std::endl; break;
    case 5: if (test5()) std::cout << "OK" << std::endl; break;
    case 6: if (test6()) std::cout << "OK" << std::endl; break;
    case 7: if (test7()) std::cout << "OK" << std::endl; break;
    case 8: if (test8()) std::cout << "OK" << std::endl; break;
    case 9: if (test9()) std::cout << "OK" << std::endl; break;
  }

  return 0;
}